

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  byte *pbVar1;
  byte bVar2;
  curl_trc_feat *pcVar3;
  unsigned_short uVar4;
  CURLcode CVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  undefined6 extraout_var;
  ulong uVar9;
  altsvc *p;
  time_t tVar10;
  uint uVar11;
  byte *pbVar12;
  char *pcVar13;
  undefined6 in_register_0000008a;
  bool bVar14;
  byte *pbVar15;
  size_t __n;
  Curl_easy *data_00;
  bool bVar16;
  byte *local_2c0;
  uint local_2b8;
  alpnid local_2b4;
  Curl_easy *local_2b0;
  alpnid local_2a8;
  uint local_2a4;
  char *end_ptr;
  char *local_298;
  char alpnbuf [10];
  long local_280;
  ulong local_270;
  char option [32];
  char namebuf [512];
  
  uVar8 = CONCAT62(in_register_0000008a,srcport) & 0xffffffff;
  local_2c0 = (byte *)value;
  memset(namebuf,0,0x200);
  alpnbuf[8] = '\0';
  alpnbuf[9] = '\0';
  alpnbuf[0] = '\0';
  alpnbuf[1] = '\0';
  alpnbuf[2] = '\0';
  alpnbuf[3] = '\0';
  alpnbuf[4] = '\0';
  alpnbuf[5] = '\0';
  alpnbuf[6] = '\0';
  alpnbuf[7] = '\0';
  CVar5 = getalnum((char **)&local_2c0,alpnbuf,10);
  if (CVar5 == CURLE_OK) {
    local_2b0 = data;
    iVar6 = curl_strequal(alpnbuf,"clear");
    if (iVar6 == 0) {
      uVar9 = (ulong)*local_2c0;
      local_280 = 0;
      pbVar12 = local_2c0;
      data_00 = local_2b0;
      local_2a8 = srcalpnid;
      do {
        if ((char)uVar9 != '=') {
          return CURLE_OK;
        }
        local_2b4 = alpn2alpnid(alpnbuf);
        if (pbVar12[1] != 0x22) {
          return CURLE_OK;
        }
        local_2a4 = (uint)uVar8;
        pbVar15 = pbVar12 + 2;
        bVar2 = pbVar12[2];
        if (bVar2 == 0x3a) {
          bVar16 = true;
          local_298 = srchost;
LAB_00110ff0:
          pbVar12 = pbVar15 + 1;
          local_2c0 = pbVar12;
          pbVar1 = pbVar12;
          if (((((byte)(pbVar15[1] - 0x30) < 10) &&
               (uVar8 = strtoul((char *)pbVar12,&end_ptr,10), pcVar13 = end_ptr,
               pbVar1 = (byte *)end_ptr, 0xffffffffffff0000 < uVar8 - 0x10000)) &&
              ((byte *)end_ptr != pbVar12)) && (*end_ptr == '\"')) {
            uVar4 = curlx_ultous(uVar8);
            local_2a4 = (uint)CONCAT62(extraout_var,uVar4);
            pbVar12 = (byte *)pcVar13;
          }
          else {
            end_ptr = (char *)pbVar1;
            if (((data_00 == (Curl_easy *)0x0) || (((data_00->set).field_0x8cd & 0x10) == 0)) ||
               ((pcVar3 = (data_00->state).feat, pcVar3 != (curl_trc_feat *)0x0 &&
                (pcVar3->log_level < 1)))) {
              bVar16 = false;
            }
            else {
              bVar16 = false;
              Curl_infof(data_00,"Unknown alt-svc port number, ignoring.");
            }
          }
        }
        else {
          if (bVar2 == 0x5b) {
            local_2c0 = pbVar12 + 3;
            sVar7 = strspn((char *)local_2c0,"0123456789abcdefABCDEF:.");
            if (pbVar12[sVar7 + 3] != 0x5d) {
              return CURLE_OK;
            }
            __n = sVar7 + 2;
            pbVar12 = pbVar12 + sVar7 + 4;
          }
          else {
            __n = 0;
            pbVar12 = pbVar15;
            while ((bVar2 != 0 &&
                   (((byte)(bVar2 + 0x9f) < 0x1a || (byte)(bVar2 - 0x30) < 10 ||
                    ((byte)(bVar2 + 0xbf) < 0x1a || (byte)(bVar2 - 0x2d) < 2))))) {
              pbVar1 = pbVar12 + 1;
              pbVar12 = pbVar12 + 1;
              __n = __n + 1;
              bVar2 = *pbVar1;
            }
          }
          data_00 = local_2b0;
          pcVar13 = namebuf;
          bVar16 = __n - 1 < 0x1ff;
          local_2c0 = pbVar12;
          if (bVar16) {
            memcpy(pcVar13,pbVar15,__n);
            namebuf[__n] = '\0';
            data_00 = local_2b0;
          }
          else {
            pcVar13 = "";
            if (((local_2b0 != (Curl_easy *)0x0) &&
                (pcVar13 = "", ((local_2b0->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar3 = (local_2b0->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                (pcVar13 = "", 0 < pcVar3->log_level)))) {
              Curl_infof(local_2b0,"Excessive alt-svc hostname, ignoring.");
              pcVar13 = "";
            }
          }
          pbVar15 = pbVar12;
          local_298 = pcVar13;
          if (*pbVar12 == 0x3a) goto LAB_00110ff0;
        }
        if (*pbVar12 != 0x22) {
          return CURLE_OK;
        }
        local_270 = 0x15180;
        bVar14 = false;
        local_2b8 = 0;
        pbVar15 = pbVar12 + 1;
        uVar8 = local_270;
        while( true ) {
          do {
            do {
              local_270 = uVar8;
              pbVar12 = pbVar15;
              local_2c0 = pbVar12 + 1;
              bVar2 = *pbVar12;
              pbVar15 = local_2c0;
              uVar8 = local_270;
            } while (bVar2 == 9);
          } while (bVar2 == 0x20);
          if ((bVar2 != 0x3b) ||
             ((*local_2c0 < 0xe && (pbVar12 = local_2c0, (0x2401U >> (*local_2c0 & 0x1f) & 1) != 0))
             )) break;
          CVar5 = getalnum((char **)&local_2c0,option,0x20);
          pbVar12 = local_2c0;
          if (CVar5 != CURLE_OK) {
            option[0] = '\0';
          }
          while( true ) {
            pbVar12 = pbVar12 + 1;
            bVar2 = *local_2c0;
            if ((bVar2 != 9) && (bVar2 != 0x20)) break;
            local_2c0 = local_2c0 + 1;
          }
          if (bVar2 != 0x3d) {
            return CURLE_OK;
          }
          for (; (bVar2 = *pbVar12, bVar2 == 9 || (bVar2 == 0x20)); pbVar12 = pbVar12 + 1) {
          }
          if (bVar2 == 0) {
            return CURLE_OK;
          }
          if (bVar2 == 0x22) {
            pbVar12 = pbVar12 + 1;
            pbVar1 = pbVar12;
LAB_00111181:
            do {
              pbVar15 = pbVar1 + 1;
              bVar2 = *pbVar1;
              if (bVar2 == 0) break;
              pbVar1 = pbVar15;
            } while (bVar2 != 0x22);
            bVar14 = true;
            if (bVar2 == 0) {
              return CURLE_OK;
            }
          }
          else {
            pbVar15 = pbVar12;
            pbVar1 = pbVar12;
            if (bVar14) goto LAB_00111181;
            while ((0x3b < (ulong)*pbVar15 ||
                   ((0x800100100000201U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))) {
              pbVar15 = pbVar15 + 1;
            }
          }
          local_2c0 = pbVar15;
          uVar9 = strtoul((char *)pbVar12,&end_ptr,10);
          if (uVar9 != 0xffffffffffffffff && (byte *)end_ptr != pbVar12) {
            iVar6 = curl_strequal("ma",option);
            uVar8 = uVar9;
            if (iVar6 == 0) {
              iVar6 = curl_strequal("persist",option);
              uVar11 = local_2b8 & 0xff;
              local_2b8 = uVar11;
              if (uVar9 == 1) {
                local_2b8 = 1;
              }
              uVar8 = local_270;
              if (iVar6 == 0) {
                local_2b8 = uVar11;
              }
            }
          }
        }
        uVar8 = (ulong)local_2a4;
        data_00 = local_2b0;
        local_2c0 = pbVar12;
        if (!(bool)(bVar16 ^ 1U | local_2b4 == ALPN_none)) {
          if (local_280 == 0) {
            altsvc_flush(asi,local_2a8,srchost,srcport);
          }
          local_280 = local_280 + 1;
          p = altsvc_createid(srchost,local_298,local_2a8,local_2b4,(uint)srcport,
                              (uint)(uVar8 & 0xffff));
          data_00 = local_2b0;
          if (p != (altsvc *)0x0) {
            tVar10 = time((time_t *)0x0);
            p->expires = tVar10 + local_270;
            p->persist = (_Bool)((byte)local_2b8 & 1);
            Curl_llist_append(&asi->list,p,&p->node);
            data_00 = local_2b0;
            if (((local_2b0 != (Curl_easy *)0x0) && (((local_2b0->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar3 = (local_2b0->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                (0 < pcVar3->log_level)))) {
              pcVar13 = "h1";
              if (local_2b4 != ALPN_h1) {
                if (local_2b4 == ALPN_h3) {
                  pcVar13 = "h3";
                }
                else if (local_2b4 == ALPN_h2) {
                  pcVar13 = "h2";
                }
                else {
                  pcVar13 = "";
                }
              }
              Curl_infof(local_2b0,"Added alt-svc: %s:%d over %s",local_298,uVar8 & 0xffff,pcVar13);
            }
          }
        }
        bVar2 = *pbVar12;
        if (bVar2 == 0x2c) {
          local_2c0 = pbVar12 + 1;
          CVar5 = getalnum((char **)&local_2c0,alpnbuf,10);
          if (CVar5 != CURLE_OK) {
            return CURLE_OK;
          }
          bVar2 = *local_2c0;
          pbVar12 = local_2c0;
        }
        uVar9 = (ulong)bVar2;
      } while ((0x3b < bVar2) || ((0x800000000002401U >> (uVar9 & 0x3f) & 1) == 0));
    }
    else {
      altsvc_flush(asi,srcalpnid,srchost,(unsigned_short)uVar8);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) {
    Curl_infof(data,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  size_t len;
  char namebuf[MAX_ALTSVC_HOSTLEN] = "";
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            len = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[len] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            len += 2;
            p = &p[len-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            len = p - hostp;
          }
          if(!len || (len >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            memcpy(namebuf, hostp, len);
            namebuf[len] = 0;
            dsthost = namebuf;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}